

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O3

size_t __thiscall kws::Parser::FindFunction(Parser *this,size_t pos,char *buffer)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  string buf;
  undefined1 *local_a0;
  char *local_98;
  undefined1 local_90 [16];
  undefined8 local_80;
  Parser *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_a0 = local_90;
  pcVar2 = (this->m_BufferNoComment)._M_dataplus._M_p;
  local_78 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar2,pcVar2 + (this->m_BufferNoComment)._M_string_length);
  pcVar5 = local_98;
  if (buffer != (char *)0x0) {
    strlen(buffer);
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,pcVar5,(ulong)buffer);
  }
  if (((pos != 0xffffffffffffffff) && (pos <= local_98 + -1)) &&
     (sVar6 = std::__cxx11::string::find((char)&local_a0,0x7d), sVar6 != 0xffffffffffffffff)) {
    do {
      sVar6 = FindOpeningChar(local_78,'}','{',sVar6,true);
      if (sVar6 + 1 < 2) goto LAB_0012300a;
      bVar4 = true;
      bVar3 = true;
      sVar8 = sVar6;
      do {
        sVar8 = sVar8 - 1;
        cVar1 = local_a0[sVar8];
        if ((cVar1 != '\r') && (cVar1 != ' ')) {
          if (cVar1 == ')') {
            if (bVar3) goto LAB_0012300a;
            std::__cxx11::string::substr((ulong)local_70,(ulong)&local_a0);
            local_80 = 0;
            lVar7 = std::__cxx11::string::find((char *)local_70,0x1697a7,0);
            if (lVar7 == -1) {
              std::__cxx11::string::substr((ulong)local_50,(ulong)&local_a0);
              lVar7 = std::__cxx11::string::find((char *)local_50,0x16d753,0);
              local_80 = CONCAT71((int7)((ulong)lVar7 >> 8),lVar7 != -1);
              if (local_50[0] != local_40) {
                operator_delete(local_50[0]);
              }
            }
            if (local_70[0] != local_60) {
              operator_delete(local_70[0]);
            }
            if ((char)local_80 != '\0') goto LAB_0012300a;
            goto LAB_00122fe1;
          }
          bVar3 = bVar4;
          if (cVar1 != '\n') {
            bVar4 = false;
            bVar3 = false;
          }
        }
      } while (sVar8 != 0);
      if (bVar3) goto LAB_0012300a;
LAB_00122fe1:
      sVar6 = std::__cxx11::string::find((char)&local_a0,0x7d);
    } while (sVar6 != 0xffffffffffffffff);
  }
  sVar6 = 0xffffffffffffffff;
LAB_0012300a:
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  return sVar6;
}

Assistant:

size_t Parser::FindFunction(size_t pos,const char* buffer) const
{
  std::string buf = m_BufferNoComment;

  if(buffer)
    {
    buf = buffer;
    }

  if((pos == std::string::npos) || pos > buf.size()-1)
    {
    return std::string::npos;
    }

  // a function is defined as:
  // function() [const] {}; and if() {} is considered as a function
  // here.

  // We go backwards
  size_t end = buf.find('}',pos);
  while(end != std::string::npos)
    {
    size_t beg = this->FindOpeningChar('}','{',end,true);
    if(beg == std::string::npos)
        {
        break;
        }

    // check that before the beg we have
    bool nospecialchar=true;
    size_t i = beg-1;
    while(i != std::string::npos)
      {
      if(buf[i] == ')')
        {
        break;
        }
      else if(
        buf[i] != ' ' && buf[i] != '\r'
        && buf[i] != '\n'
        )
        {
        nospecialchar = false;
        }
      --i;
      }

    if(nospecialchar)
      {
      return beg;
      }
    if(i != std::string::npos)// check if we have a const
      {
      if(buf.substr(i,beg-i).find("]") == std::string::npos &&
         buf.substr(i,beg-i).find("const") != std::string::npos
        )
        {
        return beg;
        }
      }
    end = buf.find('}',end+1);
    }

  return std::string::npos;
}